

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTPNObjPropBase::adjust_for_dyn(CTPNObjPropBase *this,tcpn_dyncomp_info *info)

{
  _func_int **pp_Var1;
  undefined8 in_RSI;
  CTcPrsNode *in_RDI;
  
  if (in_RDI[9].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    pp_Var1 = in_RDI[9].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    (**(code **)(*pp_Var1 + 0x88))(pp_Var1,in_RSI);
  }
  if (in_RDI[10].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    pp_Var1 = in_RDI[10].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    (**(code **)(*pp_Var1 + 0x88))(pp_Var1,in_RSI);
  }
  if (in_RDI[7].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    pp_Var1 = in_RDI[7].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x88))(pp_Var1,in_RSI);
    in_RDI[7].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  }
  return in_RDI;
}

Assistant:

CTcPrsNode *CTPNObjPropBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* adjust my various elements */
    if (code_body_ != 0)
        code_body_->adjust_for_dyn(info);
    if (inline_method_ != 0)
        inline_method_->adjust_for_dyn(info);
    if (expr_ != 0)
        expr_ = expr_->adjust_for_dyn(info);

    /* we did our adjustments in-place */
    return this;
}